

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_to_base58(ext_key *hdkey,uint32_t flags,char **output)

{
  uchar local_88 [8];
  uchar bytes [78];
  int ret;
  char **output_local;
  uint32_t flags_local;
  ext_key *hdkey_local;
  
  hdkey_local._4_4_ = bip32_key_serialize(hdkey,flags,local_88,0x4e);
  if (hdkey_local._4_4_ == 0) {
    hdkey_local._4_4_ = wally_base58_from_bytes(local_88,0x4e,1,output);
    wally_clear(local_88,0x4e);
  }
  return hdkey_local._4_4_;
}

Assistant:

int bip32_key_to_base58(const struct ext_key *hdkey,
                        uint32_t flags,
                        char **output)
{
    int ret;
    unsigned char bytes[BIP32_SERIALIZED_LEN];

    if ((ret = bip32_key_serialize(hdkey, flags, bytes, sizeof(bytes))))
        return ret;

    ret = wally_base58_from_bytes(bytes, BIP32_SERIALIZED_LEN, BASE58_FLAG_CHECKSUM, output);

    wally_clear(bytes, sizeof(bytes));
    return ret;
}